

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMap.cpp
# Opt level: O3

void __thiscall Js::JavascriptMap::PromoteToComplexVarMap(JavascriptMap *this)

{
  int iVar1;
  int iVar2;
  MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
  *pMVar3;
  code *pcVar4;
  Type TVar5;
  JavascriptMap *pJVar6;
  Type *address;
  bool bVar7;
  undefined4 *puVar8;
  Recycler *pRVar9;
  BaseDictionary<void_*,_Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  undefined1 local_78 [8];
  Iterator iter;
  MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
  *local_50;
  MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
  *local_48;
  JavascriptMap *local_40;
  Type *local_38;
  
  if (this->kind != SimpleVarMap) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptMap.cpp"
                                ,0x1e9,"(this->kind == MapKind::SimpleVarMap)",
                                "this->kind == MapKind::SimpleVarMap");
    if (!bVar7) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar8 = 0;
  }
  local_38 = &this->u;
  iVar1 = *(int *)((this->u).field2 + 0x20);
  iVar2 = *(int *)((this->u).field2 + 0x28);
  pRVar9 = RecyclableObject::GetRecycler((RecyclableObject *)this);
  local_78 = (undefined1  [8])
             &JsUtil::
              BaseDictionary<void*,Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>>>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              ::typeinfo;
  iter.list.ptr =
       (MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
        *)0x0;
  iter.current.ptr =
       (MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
        *)&DAT_ffffffffffffffff;
  pRVar9 = Memory::Recycler::TrackAllocInfo(pRVar9,(TrackAllocData *)local_78);
  this_00 = (BaseDictionary<void_*,_Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             *)new<Memory::Recycler>(0x38,pRVar9,0x387914);
  pRVar9 = RecyclableObject::GetRecycler((RecyclableObject *)this);
  JsUtil::
  BaseDictionary<void_*,_Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(this_00,pRVar9,(iVar1 - iVar2) + 1);
  local_40 = this;
  Memory::Recycler::WBSetBit((char *)local_78);
  local_78 = (undefined1  [8])&this->list;
  Memory::RecyclerWriteBarrierManager::WriteBarrier((Iterator *)local_78);
  iter.list.ptr =
       (MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
        *)0x0;
  bVar7 = MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
          ::Iterator::Next((Iterator *)local_78);
  if (bVar7) {
    do {
      pMVar3 = iter.list.ptr[1].first.ptr;
      Memory::Recycler::WBSetBit((char *)&local_50);
      local_50 = pMVar3;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_50);
      TVar5 = iter.list;
      Memory::Recycler::WBSetBit((char *)&local_48);
      local_48 = (MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
                  *)TVar5.ptr;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_48);
      JsUtil::
      BaseDictionary<void*,Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>>>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<void*,Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>>>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                ((BaseDictionary<void*,Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>>>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)this_00,&local_50,&local_48);
      bVar7 = MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
              ::Iterator::Next((Iterator *)local_78);
    } while (bVar7);
  }
  address = local_38;
  pJVar6 = local_40;
  local_40->kind = ComplexVarMap;
  Memory::Recycler::WBSetBit((char *)&local_38->simpleVarMap);
  *(BaseDictionary<void_*,_Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    **)&(pJVar6->u).simpleVarMap = this_00;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(address);
  return;
}

Assistant:

void
JavascriptMap::PromoteToComplexVarMap()
{
    AssertOrFailFast(this->kind == MapKind::SimpleVarMap);

    uint newMapSize = this->u.simpleVarMap->Count() + 1;
    ComplexVarDataMap* newMap = RecyclerNew(this->GetRecycler(), ComplexVarDataMap, this->GetRecycler(), newMapSize);

    JavascriptMap::MapDataList::Iterator iter = this->list.GetIterator();
    // TODO: we can use a more efficient Iterator, since we know there will be no side effects
    while (iter.Next())
    {
        newMap->Add(iter.Current().Key(), iter.CurrentNode());
    }

    this->kind = MapKind::ComplexVarMap;
    this->u.complexVarMap = newMap;
}